

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::SerializationException::
SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (SerializationException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3)

{
  LogicalType *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  LogicalType *in_R8;
  string *in_stack_fffffffffffffef8;
  string local_90 [32];
  string local_70 [32];
  string local_50 [40];
  LogicalType *params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1_00;
  
  params_2_00 = in_RCX;
  params_1_00 = in_RDX;
  ::std::__cxx11::string::string(local_70,(string *)in_RDX);
  ::std::__cxx11::string::string(local_90,(string *)in_RCX);
  LogicalType::LogicalType((LogicalType *)in_RDX,(LogicalType *)in_stack_fffffffffffffef8);
  LogicalType::LogicalType((LogicalType *)in_RDX,(LogicalType *)in_stack_fffffffffffffef8);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (in_RDI,in_RSI,params_1_00,params_2_00,in_R8);
  SerializationException((SerializationException *)in_RDX,in_stack_fffffffffffffef8);
  ::std::__cxx11::string::~string(local_50);
  LogicalType::~LogicalType((LogicalType *)0xe65c03);
  LogicalType::~LogicalType((LogicalType *)0xe65c0d);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}